

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Privkey_Testnet_Compress_Test::Descriptor_Parse_Privkey_Testnet_Compress_Test
          (Descriptor_Parse_Privkey_Testnet_Compress_Test *this)

{
  Descriptor_Parse_Privkey_Testnet_Compress_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__Descriptor_Parse_Privkey_Testnet_Compress_Test_009e44b0;
  return;
}

Assistant:

TEST(Descriptor, Parse_Privkey_Testnet_Compress) {
  //   pubkey: '03563a11061eb1422738e6bd6d932ce75f3be6915a9db28242437cff274781e973',
  //   privkey: 'cTffYQiudjHLwLdyiq4Vhj87c8vmsfeU49qj24K2coyXoGQ1eo5L'
  std::string pubkey_hex = "03563a11061eb1422738e6bd6d932ce75f3be6915a9db28242437cff274781e973";
  std::string descriptor1 = "pkh(cTffYQiudjHLwLdyiq4Vhj87c8vmsfeU49qj24K2coyXoGQ1eo5L)";
  std::string descriptor2 = "wpkh(cTffYQiudjHLwLdyiq4Vhj87c8vmsfeU49qj24K2coyXoGQ1eo5L)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  Pubkey pubkey;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "OP_DUP OP_HASH160 87fccc805971853683673046575a707df4e94500 OP_EQUALVERIFY OP_CHECKSIG");
  EXPECT_STREQ(pubkey.GetHex().c_str(),
      pubkey_hex.c_str());
  EXPECT_TRUE(pubkey.IsCompress());

  try {
    desc = Descriptor::Parse(descriptor2);
    EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
    EXPECT_NO_THROW(script_ref = desc.GetReference());
    EXPECT_NO_THROW(desc_str = desc.ToString(false));
    EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetPubkey());
    EXPECT_STREQ(desc_str.c_str(), descriptor2.c_str());
    EXPECT_STREQ(locking_script.ToString().c_str(),
        "0 87fccc805971853683673046575a707df4e94500");
    EXPECT_STREQ(pubkey.GetHex().c_str(),
        pubkey_hex.c_str());
    EXPECT_TRUE(pubkey.IsCompress());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}